

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall ON_MappingRef::Compare(ON_MappingRef *this,ON_MappingRef *other)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  
  iVar2 = ON_UuidCompare(&this->m_plugin_id,&other->m_plugin_id);
  if (iVar2 == 0) {
    iVar1 = (this->m_mapping_channels).m_count;
    iVar2 = iVar1 - (other->m_mapping_channels).m_count;
    if (iVar2 == 0) {
      lVar3 = 0;
      iVar2 = 0;
      for (lVar4 = 0; (iVar2 == 0 && (lVar4 < iVar1)); lVar4 = lVar4 + 1) {
        iVar2 = ON_MappingChannel::Compare
                          ((ON_MappingChannel *)
                           ((((this->m_mapping_channels).m_a)->m_mapping_id).Data4 + lVar3 + -8),
                           (ON_MappingChannel *)
                           ((((other->m_mapping_channels).m_a)->m_mapping_id).Data4 + lVar3 + -8));
        lVar3 = lVar3 + 0x98;
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_MappingRef::Compare( const ON_MappingRef& other ) const
{
  int rc = ON_UuidCompare(m_plugin_id,other.m_plugin_id);
  if ( !rc)
  {
    const int count = m_mapping_channels.Count();
    rc = count - other.m_mapping_channels.Count();
    if (!rc)
    {
      for ( int i = 0; i < count && !rc; i++ )
      {
        rc = m_mapping_channels[i].Compare(other.m_mapping_channels[i]);
      }
    }
  }
  return rc;
}